

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

void __thiscall
icu_63::StringLocalizationInfo::~StringLocalizationInfo(StringLocalizationInfo *this)

{
  UChar ***local_18;
  UChar ***p;
  StringLocalizationInfo *this_local;
  
  (this->super_LocalizationInfo)._vptr_LocalizationInfo =
       (_func_int **)&PTR__StringLocalizationInfo_0049c350;
  for (local_18 = this->data; *local_18 != (UChar **)0x0; local_18 = local_18 + 1) {
    if (*local_18 != (UChar **)0x0) {
      uprv_free_63(*local_18);
    }
  }
  if (this->data != (UChar ***)0x0) {
    uprv_free_63(this->data);
  }
  if (this->info != (UChar *)0x0) {
    uprv_free_63(this->info);
  }
  LocalizationInfo::~LocalizationInfo(&this->super_LocalizationInfo);
  return;
}

Assistant:

StringLocalizationInfo::~StringLocalizationInfo() {
    for (UChar*** p = (UChar***)data; *p; ++p) {
        // remaining data is simply pointer into our unicode string data.
        if (*p) uprv_free(*p);
    }
    if (data) uprv_free(data);
    if (info) uprv_free(info);
}